

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benckmark.cpp
# Opt level: O0

void __thiscall BenchMark::run(BenchMark *this)

{
  ostream *poVar1;
  int local_138;
  int local_134;
  int i_2;
  int i_1;
  uint64_t total_time;
  uint64_t total_response_num;
  uint64_t total_request_num;
  BenchMark *local_108;
  code *local_100;
  undefined8 local_f8;
  type local_f0;
  ThreadTask local_d0;
  int local_ac;
  undefined1 local_a8 [4];
  int i;
  ThreadPool threadPool;
  BenchMark *this_local;
  
  g_is_loop = true;
  threadPool.taskQueue_.c.
  super__Deque_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>._M_impl.
  super__Deque_impl_data._M_finish._M_node = (_Map_pointer)this;
  addsig(0xe);
  addsig(0xf);
  alarm(gOption.duration_);
  ThreadPool::ThreadPool((ThreadPool *)local_a8,gOption.thread_num_ - 1);
  for (local_ac = 1; (ulong)(long)local_ac < gOption.thread_num_; local_ac = local_ac + 1) {
    local_100 = benchmark;
    local_f8 = 0;
    local_108 = this;
    std::bind<void(BenchMark::*)(int),BenchMark*,int&>
              (&local_f0,(offset_in_BenchMark_to_subr *)&local_100,&local_108,&local_ac);
    std::function<void()>::function<std::_Bind<void(BenchMark::*(BenchMark*,int))(int)>,void>
              ((function<void()> *)&local_d0,&local_f0);
    ThreadPool::appendTask((ThreadPool *)local_a8,&local_d0);
    std::function<void_()>::~function(&local_d0);
  }
  ThreadPool::run((ThreadPool *)local_a8);
  benchmark(this,0);
  total_response_num = 0;
  total_time = 0;
  _i_2 = 0;
  for (local_134 = 0; (ulong)(long)local_134 < gOption.thread_num_; local_134 = local_134 + 1) {
    total_response_num = this->testResult_[local_134].request_num_ + total_response_num;
    total_time = this->testResult_[local_134].response_num_ + total_time;
    _i_2 = this->testResult_[local_134].use_timer_ + _i_2;
  }
  for (local_138 = 0; (ulong)(long)local_138 < gOption.thread_num_; local_138 = local_138 + 1) {
    poVar1 = std::operator<<((ostream *)&std::cout,"this is thread ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_138);
    std::operator<<(poVar1," :\n");
    poVar1 = std::operator<<((ostream *)&std::cout,"\tconnect  time : ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,gOption.concurrent_num_);
    poVar1 = std::operator<<(poVar1," use : ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->testResult_[local_138].connect_time_);
    std::operator<<(poVar1," us\n");
    poVar1 = std::operator<<((ostream *)&std::cout,"\tuse      time : ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->testResult_[local_138].use_timer_);
    std::operator<<(poVar1," \n");
    poVar1 = std::operator<<((ostream *)&std::cout,"\trequest  num  : ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->testResult_[local_138].request_num_);
    std::operator<<(poVar1," \n");
    poVar1 = std::operator<<((ostream *)&std::cout,"\tresponse num  : ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->testResult_[local_138].response_num_);
    std::operator<<(poVar1," \n");
  }
  std::operator<<((ostream *)&std::cout,"total result : \n");
  poVar1 = std::operator<<((ostream *)&std::cout,"\ttotal request  num  is : ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,total_response_num);
  std::operator<<(poVar1,"\n");
  poVar1 = std::operator<<((ostream *)&std::cout,"\ttotal response num  is : ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,total_time);
  std::operator<<(poVar1,"\n");
  poVar1 = std::operator<<((ostream *)&std::cout,"\ttotal use     time  is : ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,_i_2);
  std::operator<<(poVar1,"\n");
  poVar1 = std::operator<<((ostream *)&std::cout,"\tQPS                 is : ");
  poVar1 = (ostream *)
           std::ostream::operator<<(poVar1,((total_time * 1000000) / _i_2) * gOption.thread_num_);
  std::operator<<(poVar1,"\n");
  ThreadPool::~ThreadPool((ThreadPool *)local_a8);
  return;
}

Assistant:

void BenchMark::run()
{
    g_is_loop = true;
    //设置测试时间
    addsig(SIGALRM);
    addsig(SIGTERM);
    alarm(gOption.duration_);
 
    ThreadPool threadPool(gOption.thread_num_ - 1);
   
    for (int i = 1; i < gOption.thread_num_; ++i) {
        threadPool.appendTask(std::bind(&BenchMark::benchmark, this, i));
    }
    threadPool.run();
    benchmark(0);
    //threadPool.join();
    //sleep(1);
    //统计测试结果

    /*
     *  QPS = req/sec = 请求数/秒
     *  QPS = 总请求数 / ( 进程总数 *   请求时间 )
     *  QPS: 单个进程每秒请求服务器的成功次数
     *
     */
    uint64_t total_request_num = 0;
    uint64_t total_response_num = 0;
    uint64_t total_time = 0;
    for (int i = 0; i < gOption.thread_num_; ++i) {
        total_request_num += testResult_[i].request_num_;
        total_response_num += testResult_[i].response_num_;
        total_time += testResult_[i].use_timer_;
    }

    for(int i = 0;i < gOption.thread_num_;++i)
    {
        std::cout << "this is thread " << i << " :\n";
        std::cout << "\tconnect  time : " << gOption.concurrent_num_ << " use : " << testResult_[i].connect_time_ << " us\n";
        std::cout << "\tuse      time : " << testResult_[i].use_timer_ << " \n";
        std::cout << "\trequest  num  : " << testResult_[i].request_num_ << " \n";
        std::cout << "\tresponse num  : " << testResult_[i].response_num_ << " \n";
    }

    std::cout<<"total result : \n";
    std::cout << "\ttotal request  num  is : " << total_request_num << "\n";
    std::cout << "\ttotal response num  is : " << total_response_num << "\n";
    std::cout << "\ttotal use     time  is : " << total_time << "\n";
    std::cout << "\tQPS                 is : " << (total_response_num*(1000 * 1000) /total_time)*gOption.thread_num_   << "\n";
}